

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O1

FT_Error T42_Face_Init(FT_Stream stream,FT_Face t42face,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  byte *pbVar1;
  FT_Byte FVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  FT_Memory memory;
  FT_Stream stream_00;
  uchar *puVar6;
  FT_GlyphSlot_conflict pFVar7;
  FT_Bitmap_Size *pFVar8;
  FT_Pos FVar9;
  FT_Pos FVar10;
  FT_Pos FVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  FT_Error FVar14;
  int iVar15;
  FT_Pointer pvVar16;
  FT_String *pFVar17;
  FT_String *pFVar18;
  FT_Face pFVar19;
  PS_Parser buffer;
  FT_UInt FVar20;
  FT_Memory pFVar21;
  FT_Face pFVar22;
  char *pcVar23;
  uint uVar24;
  FT_Face extraout_RDX;
  FT_Face extraout_RDX_00;
  FT_Face extraout_RDX_01;
  FT_Face extraout_RDX_02;
  FT_Face extraout_RDX_03;
  FT_Face extraout_RDX_04;
  FT_Face extraout_RDX_05;
  FT_Face extraout_RDX_06;
  FT_Face __n;
  FT_Face extraout_RDX_07;
  FT_Face extraout_RDX_08;
  FT_Face extraout_RDX_09;
  FT_Face extraout_RDX_10;
  FT_Face extraout_RDX_11;
  FT_Face extraout_RDX_12;
  FT_Face extraout_RDX_13;
  FT_Face extraout_RDX_14;
  FT_Face extraout_RDX_15;
  FT_Fixed *extraout_RDX_16;
  FT_Face extraout_RDX_17;
  FT_Face pFVar25;
  FT_Face extraout_RDX_18;
  FT_Face extraout_RDX_19;
  FT_Face extraout_RDX_20;
  FT_Face extraout_RDX_21;
  FT_Face extraout_RDX_22;
  FT_Face extraout_RDX_23;
  uint uVar26;
  undefined1 auVar27 [8];
  ulong uVar28;
  undefined8 *puVar29;
  FT_Int FVar30;
  char *pcVar31;
  FT_Library pFVar32;
  FT_Library __s2;
  PS_Parser pPVar33;
  FT_CMap_Class clazz;
  long lVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 local_2e8 [8];
  T42_LoaderRec loader;
  undefined1 local_70 [32];
  FT_Face local_50;
  FT_Face local_48;
  FT_Face local_40;
  uint local_34;
  
  t42face[3].available_sizes = (FT_Bitmap_Size *)0x0;
  t42face->num_faces = 1;
  FVar20 = num_params;
  pvVar16 = ft_module_get_service(&t42face->driver->root,"postscript-cmaps",'\x01');
  t42face[3].num_glyphs = (FT_Long)pvVar16;
  pFVar17 = (FT_String *)FT_Get_Module_Interface((t42face->driver->root).library,"psaux");
  t42face[3].family_name = pFVar17;
  if (pFVar17 == (FT_String *)0x0) {
    return 0xb;
  }
  memory = t42face->memory;
  loader.swap_table.funcs.release = (_func_void_PS_Table *)params;
  memset(local_2e8,0,0x240);
  FVar30 = 0xc;
  pFVar18 = (FT_String *)ft_mem_alloc(memory,0xc,(FT_Error *)&local_34);
  t42face[3].style_name = pFVar18;
  pFVar25 = extraout_RDX;
  if (local_34 == 0) {
    *(undefined8 *)&t42face[3].num_fixed_sizes = 0xc;
    stream_00 = t42face->stream;
    local_70._0_8_ = local_70._0_8_ & 0xffffffff00000000;
    pFVar21 = memory;
    local_70._24_8_ = pFVar17;
    (*(code *)**(undefined8 **)(pFVar17 + 8))(local_2e8,0,0);
    loader.parser.stream = (FT_Stream)0x0;
    loader.parser.base_dict = (FT_Byte *)0x0;
    loader.parser.base_len._0_1_ = '\0';
    pcVar31 = (char *)0x0;
    loader.parser.root.funcs.load_field_table =
         (_func_FT_Error_PS_Parser_T1_Field_void_ptr_ptr_FT_UInt_FT_ULong_ptr *)stream_00;
    FVar14 = FT_Stream_Seek(stream_00,0);
    local_70._0_4_ = FVar14;
    pFVar25 = extraout_RDX_00;
    if (FVar14 == 0) {
      pcVar31 = (char *)0x11;
      FVar14 = FT_Stream_EnterFrame(stream_00,0x11);
      local_70._0_4_ = FVar14;
      pFVar25 = extraout_RDX_01;
      if (FVar14 == 0) {
        puVar6 = stream_00->cursor;
        auVar36[0] = -(*puVar6 == '%');
        auVar36[1] = -(puVar6[1] == '!');
        auVar36[2] = -(puVar6[2] == 'P');
        auVar36[3] = -(puVar6[3] == 'S');
        auVar36[4] = -(puVar6[4] == '-');
        auVar36[5] = -(puVar6[5] == 'T');
        auVar36[6] = -(puVar6[6] == 'r');
        auVar36[7] = -(puVar6[7] == 'u');
        auVar36[8] = -(puVar6[8] == 'e');
        auVar36[9] = -(puVar6[9] == 'T');
        auVar36[10] = -(puVar6[10] == 'y');
        auVar36[0xb] = -(puVar6[0xb] == 'p');
        auVar36[0xc] = -(puVar6[0xc] == 'e');
        auVar36[0xd] = -(puVar6[0xd] == 'F');
        auVar36[0xe] = -(puVar6[0xe] == 'o');
        auVar36[0xf] = -(puVar6[0xf] == 'n');
        auVar37[0] = -(puVar6[0x10] == 't');
        auVar37[1] = 0xff;
        auVar37[2] = 0xff;
        auVar37[3] = 0xff;
        auVar37[4] = 0xff;
        auVar37[5] = 0xff;
        auVar37[6] = 0xff;
        auVar37[7] = 0xff;
        auVar37[8] = 0xff;
        auVar37[9] = 0xff;
        auVar37[10] = 0xff;
        auVar37[0xb] = 0xff;
        auVar37[0xc] = 0xff;
        auVar37[0xd] = 0xff;
        auVar37[0xe] = 0xff;
        auVar37[0xf] = 0xff;
        auVar37 = auVar37 & auVar36;
        if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) != 0xffff) {
          local_70._0_4_ = 2;
        }
        FT_Stream_ExitFrame(stream_00);
        pFVar25 = extraout_RDX_02;
        if (local_70._0_4_ == 0) {
          pcVar31 = (char *)0x0;
          FVar14 = FT_Stream_Seek(stream_00,0);
          local_70._0_4_ = FVar14;
          pFVar25 = extraout_RDX_03;
          if (FVar14 == 0) {
            pPVar33 = (PS_Parser)stream_00->size;
            if (stream_00->read == (FT_Stream_IoFunc)0x0) {
              loader.parser.base_dict = (FT_Byte *)pPVar33;
              loader.parser.stream = (FT_Stream)(stream_00->base + stream_00->pos);
              loader.parser.base_len._0_1_ = '\x01';
              FVar14 = FT_Stream_Skip(stream_00,(FT_Long)pPVar33);
              local_70._0_4_ = FVar14;
              pFVar25 = extraout_RDX_23;
              pcVar31 = (char *)pPVar33;
              if (FVar14 == 0) {
LAB_00237ebc:
                local_2e8 = (undefined1  [8])loader.parser.stream;
                loader.parser.root.base =
                     loader.parser.base_dict + (long)&(loader.parser.stream)->base;
                pcVar31 = (char *)pPVar33;
                loader.parser.root.cursor = (FT_Byte *)local_2e8;
              }
            }
            else {
              pcVar31 = (char *)pPVar33;
              buffer = (PS_Parser)ft_mem_alloc(memory,(FT_Long)pPVar33,(FT_Error *)local_70);
              loader.parser.stream = (FT_Stream)buffer;
              pFVar25 = extraout_RDX_21;
              if (local_70._0_4_ == 0) {
                FVar14 = FT_Stream_Read(stream_00,(FT_Byte *)buffer,(FT_ULong)pPVar33);
                local_70._0_4_ = FVar14;
                pFVar25 = extraout_RDX_22;
                pcVar31 = (char *)buffer;
                if (FVar14 == 0) {
                  loader.parser.base_dict = (FT_Byte *)pPVar33;
                  pPVar33 = buffer;
                  goto LAB_00237ebc;
                }
              }
            }
          }
        }
      }
    }
    if ((local_70._0_4_ != 0) && ((char)loader.parser.base_len == '\0')) {
      pcVar31 = (char *)loader.parser.stream;
      ft_mem_free(memory,loader.parser.stream);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = loader.parser.base_dict;
      loader.parser._144_16_ = auVar12 << 0x40;
      pFVar25 = extraout_RDX_04;
    }
    pFVar17 = (FT_String *)local_70._24_8_;
    FVar30 = (FT_Int)pcVar31;
    FVar20 = (FT_UInt)pFVar21;
    local_34 = local_70._0_4_;
    if (local_70._0_4_ == 0) {
      local_2e8 = (undefined1  [8])loader.parser.stream;
      pFVar19 = (FT_Face)(loader.parser.base_dict + (long)&(loader.parser.stream)->base);
      loader.parser.root.limit._0_4_ = 0;
      loader.parser.root.base = (FT_Byte *)pFVar19;
      (*loader.parser.root.funcs.done)((PS_Parser)local_2e8);
      local_48 = t42face + 1;
      pFVar25 = extraout_RDX_05;
      do {
        auVar27 = local_2e8;
        FVar30 = (FT_Int)pcVar31;
        FVar20 = (FT_UInt)pFVar21;
        uVar24 = (uint)loader.parser.root.limit;
        if (pFVar19 <= (ulong)local_2e8) goto LAB_00237855;
        FVar2 = *(FT_Byte *)(uchar **)local_2e8;
        pFVar25 = (FT_Face)((long)((long)local_2e8 + 0x18) + 1);
        pFVar21 = (FT_Memory)CONCAT71((int7)((ulong)pFVar25 >> 8),pFVar25 < pFVar19 && FVar2 == 'F')
        ;
        if (pFVar25 < pFVar19 && FVar2 == 'F') {
          pcVar31 = "FontDirectory";
          iVar15 = strncmp((char *)local_2e8,"FontDirectory",0xd);
          if (iVar15 != 0) goto LAB_002375ac;
          (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_2e8);
          (*loader.parser.root.funcs.done)((PS_Parser)local_2e8);
          auVar27 = local_2e8;
          pFVar25 = extraout_RDX_13;
          while ((ulong)local_2e8 < pFVar19) {
            bVar35 = *(FT_Byte *)&((FT_Face)local_2e8)->num_faces == 'k';
            pFVar25 = (FT_Face)((long)&((FT_Face)local_2e8)->num_faces + 5);
            pFVar21 = (FT_Memory)CONCAT71((int7)((ulong)pFVar25 >> 8),pFVar25 < pFVar19 && bVar35);
            if (pFVar25 < pFVar19 && bVar35) {
              pcVar31 = "known";
              iVar15 = strncmp((char *)local_2e8,"known",5);
              if (iVar15 == 0) {
                (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_2e8);
                pcVar31 = local_70;
                (*loader.parser.root.funcs.to_fixed_array)
                          ((PS_Parser)local_2e8,(FT_Int)pcVar31,extraout_RDX_16,(FT_Int)pFVar21);
                pFVar25 = extraout_RDX_17;
                if (local_70._16_4_ == 3) {
                  auVar27 = local_2e8;
                }
                break;
              }
            }
            (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_2e8);
            if ((uint)loader.parser.root.limit != 0) {
              uVar26 = 6;
              bVar35 = false;
              pFVar25 = extraout_RDX_14;
              goto LAB_0023782e;
            }
            (*loader.parser.root.funcs.done)((PS_Parser)local_2e8);
            pFVar25 = extraout_RDX_15;
          }
          uVar26 = 0;
          bVar35 = true;
          local_2e8 = auVar27;
LAB_0023782e:
          if (bVar35) goto LAB_0023773d;
        }
        else {
LAB_002375ac:
          pFVar25 = (FT_Face)((long)(uchar **)auVar27 + 2);
          pFVar21 = (FT_Memory)
                    CONCAT71((int7)((ulong)pFVar25 >> 8),pFVar25 < pFVar19 && FVar2 == '/');
          if (pFVar25 < pFVar19 && FVar2 == '/') {
            pFVar22 = (FT_Face)((long)(uchar **)auVar27 + 1);
            local_2e8 = (undefined1  [8])pFVar22;
            (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_2e8);
            uVar26 = 6;
            pFVar25 = extraout_RDX_06;
            uVar24 = uVar26;
            if ((uint)loader.parser.root.limit == 0) {
              uVar24 = (int)((long)local_2e8 - (long)pFVar22) - 1;
              bVar35 = uVar24 < 0x15;
              pFVar25 = (FT_Face)(ulong)CONCAT31((int3)(uVar24 >> 8),bVar35);
              pFVar21 = (FT_Memory)CONCAT71(local_2e8._1_7_,(ulong)local_2e8 < pFVar19 && bVar35);
              if ((ulong)local_2e8 < pFVar19 && bVar35) {
                __n = (FT_Face)((long)local_2e8 - (long)pFVar22 & 0xffffffff);
                lVar34 = 0;
                pFVar25 = __n;
                local_40 = pFVar19;
                do {
                  pPVar33 = *(PS_Parser *)((long)&t42_keywords[0].ident + lVar34);
                  if (pPVar33 == (PS_Parser)0x0) {
                    uVar26 = 9;
                  }
                  else {
                    uVar26 = 0;
                    if (((*(FT_Byte *)&pFVar22->num_faces == *(FT_Byte *)&pPVar33->cursor) &&
                        (pFVar19 = (FT_Face)strlen((char *)pPVar33), pFVar25 = __n, uVar26 = 0,
                        __n == pFVar19)) &&
                       (iVar15 = bcmp(pFVar22,pPVar33,(size_t)__n), pFVar25 = extraout_RDX_07,
                       pcVar31 = (char *)pPVar33, iVar15 == 0)) {
                      iVar15 = *(int *)((long)&t42_keywords[0].type + lVar34);
                      if (iVar15 == 0xb) {
                        pcVar31 = (char *)local_2e8;
                        (**(code **)((long)&t42_keywords[0].reader + lVar34))(t42face);
                        pFVar25 = extraout_RDX_08;
                      }
                      else {
                        iVar5 = *(int *)((long)&t42_keywords[0].location + lVar34);
                        local_70._0_8_ = &t42face[1].num_fixed_sizes;
                        if ((iVar5 != 2) && (local_70._0_8_ = &t42face[2].extensions, iVar5 != 5)) {
                          local_70._0_8_ = local_48;
                        }
                        pcVar31 = (char *)((long)&t42_keywords[0].ident + lVar34);
                        if (iVar15 - 9U < 2) {
                          loader.parser.root.limit._0_4_ =
                               (*loader.parser.root.funcs.load_field)
                                         ((PS_Parser)local_2e8,(T1_Field)pcVar31,(void **)local_70,0
                                          ,(FT_ULong *)0x0);
                          pFVar25 = extraout_RDX_09;
                        }
                        else {
                          loader.parser.root.limit._0_4_ =
                               (*loader.parser.root.funcs.to_token_array)
                                         ((PS_Parser)local_2e8,(T1_Token)pcVar31,(FT_UInt)local_70,
                                          (FT_Int *)0x0);
                          pFVar25 = extraout_RDX_10;
                        }
                      }
                      uVar26 = 1;
                      if ((uint)loader.parser.root.limit == 0) {
                        uVar26 = 7;
                      }
                      uVar24 = (uint)local_50;
                      if ((uint)loader.parser.root.limit != 0) {
                        uVar24 = (uint)loader.parser.root.limit;
                      }
                      pFVar21 = (FT_Memory)(ulong)uVar24;
                      local_50 = (FT_Face)CONCAT44(local_50._4_4_,uVar24);
                    }
                  }
                  pFVar17 = (FT_String *)local_70._24_8_;
                  pFVar19 = local_40;
                  if ((uVar26 != 0) && (uVar26 != 9)) {
                    uVar24 = uVar26;
                    if (uVar26 == 7) {
                      uVar26 = 0;
                      uVar24 = uVar26;
                    }
                    goto joined_r0x0023773b;
                  }
                  lVar34 = lVar34 + 0x30;
                } while (lVar34 != 0x3c0);
                uVar26 = 0;
                uVar24 = uVar26;
              }
              else {
                uVar26 = 0;
                uVar24 = uVar26;
              }
            }
          }
          else {
            (*loader.parser.root.funcs.skip_spaces)((PS_Parser)local_2e8);
            uVar26 = 6;
            pFVar25 = extraout_RDX_11;
            uVar24 = (uint)loader.parser.root.limit;
          }
joined_r0x0023773b:
          if (uVar24 == 0) {
LAB_0023773d:
            (*loader.parser.root.funcs.done)((PS_Parser)local_2e8);
            uVar26 = 0;
            pFVar25 = extraout_RDX_12;
          }
        }
        FVar30 = (FT_Int)pcVar31;
        FVar20 = (FT_UInt)pFVar21;
      } while (uVar26 == 0);
      uVar24 = (uint)loader.parser.root.limit;
      if (uVar26 != 6) {
        uVar24 = (uint)local_50;
      }
LAB_00237855:
      local_34 = uVar24;
      if (uVar24 == 0) {
        if (*(char *)((long)&t42face[2].driver + 1) == '*') {
          t42face[2].max_advance_width = loader.encoding_table.funcs.release._0_2_;
          t42face[2].max_advance_height = loader.encoding_table.funcs.release._2_2_;
          if (loader.charstrings.capacity == 0) {
            local_34 = 3;
          }
          FVar20 = 0;
          loader.charstrings.capacity = 0;
          t42face[2].generic.finalizer = (FT_Generic_Finalizer)loader.glyph_names.funcs.release;
          t42face[2].size = (FT_Size)loader.charstrings._32_8_;
          t42face[2].charmap = (FT_CharMap)loader.charstrings.elements;
          t42face[2].bbox.xMin = loader._280_8_;
          t42face[2].glyph = (FT_GlyphSlot_conflict)loader.glyph_names._32_8_;
          loader.num_glyphs = 0;
          loader._284_4_ = 0;
          loader.glyph_names.max_elems = 0;
          loader.glyph_names.num_elems = 0;
          if (*(int *)&t42face[2].style_name == 1) {
            local_40 = (FT_Face)0x0;
            pFVar25 = (FT_Face)(long)(int)loader.encoding_table.init;
            local_48 = (FT_Face)0x0;
            FVar20 = 0;
            if (0 < (long)pFVar25) {
              pFVar19 = (FT_Face)0x0;
              local_48 = (FT_Face)0x0;
              local_40 = (FT_Face)0x0;
              local_50 = pFVar25;
              do {
                *(undefined2 *)(*(long *)&t42face[2].num_charmaps + (long)pFVar19 * 2) = 0;
                FVar30 = 0x26b397;
                t42face[2].charmaps[(long)pFVar19] = (FT_CharMap)".notdef";
                pcVar31 = *(char **)(loader.encoding_table._32_8_ + (long)pFVar19 * 8);
                pFVar22 = (FT_Face)CONCAT71(loader.encoding_table._33_7_,
                                            pcVar31 == (char *)0x0 ||
                                            (int)(uint)loader.encoding_table.funcs.release < 1);
                FVar20 = (FT_UInt)pFVar22;
                if (pcVar31 != (char *)0x0 && (int)(uint)loader.encoding_table.funcs.release >= 1) {
                  pFVar7 = t42face[2].glyph;
                  uVar28 = 0;
                  do {
                    __s2 = (&pFVar7->library)[uVar28];
                    pFVar32 = __s2;
                    iVar15 = strcmp(pcVar31,(char *)__s2);
                    FVar30 = (FT_Int)pFVar32;
                    if (iVar15 == 0) {
                      *(short *)(*(long *)&t42face[2].num_charmaps + (long)pFVar19 * 2) =
                           (short)uVar28;
                      t42face[2].charmaps[(long)pFVar19] = (FT_CharMap)__s2;
                      pFVar22 = t42face;
                      iVar15 = strcmp(".notdef",(char *)__s2);
                      FVar30 = (FT_Int)__s2;
                      if (iVar15 != 0) {
                        if ((int)pFVar19 < (int)local_40) {
                          local_40 = pFVar19;
                        }
                        local_40 = (FT_Face)((ulong)local_40 & 0xffffffff);
                        iVar15 = (int)local_48;
                        pFVar22 = (FT_Face)((ulong)local_48 & 0xffffffff);
                        local_48 = pFVar22;
                        if ((long)iVar15 <= (long)pFVar19) {
                          pFVar22 = (FT_Face)(ulong)((int)pFVar19 + 1);
                          local_48 = pFVar22;
                        }
                      }
                      break;
                    }
                    uVar28 = uVar28 + 1;
                  } while ((uint)loader.encoding_table.funcs.release != uVar28);
                  FVar20 = (FT_UInt)pFVar22;
                  pFVar25 = local_50;
                  pFVar17 = (FT_String *)local_70._24_8_;
                }
                pFVar19 = (FT_Face)((long)&pFVar19->num_faces + 1);
              } while (pFVar19 != pFVar25);
            }
            *(int *)&t42face[2].field_0x3c = (int)local_40;
            *(int *)&t42face[2].available_sizes = (int)local_48;
            t42face[2].num_fixed_sizes = loader.parser._168_4_;
          }
        }
        else {
          local_34 = 2;
        }
      }
    }
  }
  if (loader.encoding_table.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.encoding_table.funcs.add)((PS_Table)&loader.num_chars,FVar30,pFVar25,FVar20);
    pFVar25 = extraout_RDX_18;
  }
  if (loader.charstrings.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.charstrings.funcs.add)
              ((PS_Table)&loader.glyph_names.funcs.release,FVar30,pFVar25,FVar20);
    pFVar25 = extraout_RDX_19;
  }
  if (loader.glyph_names.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.glyph_names.funcs.add)((PS_Table)&loader.num_glyphs,FVar30,pFVar25,FVar20);
    pFVar25 = extraout_RDX_20;
  }
  if (loader.swap_table.funcs.add != (_func_FT_Error_PS_Table_FT_Int_void_ptr_FT_UInt *)0x0) {
    (*loader.swap_table.funcs.add)
              ((PS_Table)&loader.charstrings.funcs.release,FVar30,pFVar25,FVar20);
  }
  if ((char)loader.parser.base_len == '\0') {
    ft_mem_free((FT_Memory)loader.parser.root._24_8_,loader.parser.stream);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = loader.parser.base_dict;
    loader.parser._144_16_ = auVar13 << 0x40;
  }
  (*(code *)CONCAT44(loader.parser.root.funcs.init._4_4_,(FT_Int)loader.parser.root.funcs.init))();
  if (face_index < 0 || local_34 != 0) {
    return local_34;
  }
  if ((short)face_index != 0) {
    return 6;
  }
  iVar15._0_2_ = t42face[2].max_advance_width;
  iVar15._2_2_ = t42face[2].max_advance_height;
  t42face->num_glyphs = (long)iVar15;
  t42face->num_charmaps = 0;
  t42face->face_index = 0;
  uVar28 = t42face->face_flags;
  t42face->face_flags = uVar28 | 0x211;
  if (*(char *)&t42face[1].style_name != '\0') {
    t42face->face_flags = uVar28 | 0x215;
  }
  pbVar1 = (byte *)((long)&t42face->face_flags + 1);
  *pbVar1 = *pbVar1 | 8;
  pcVar31 = (char *)t42face[1].style_flags;
  t42face->family_name = pcVar31;
  t42face->style_name = "Regular";
  if (pcVar31 == (char *)0x0) {
    if (t42face[2].family_name != (FT_String *)0x0) {
      t42face->family_name = t42face[2].family_name;
    }
  }
  else {
    pcVar23 = (char *)t42face[1].face_flags;
    if (pcVar23 != (char *)0x0) {
      while (cVar3 = *pcVar23, cVar3 != '\0') {
        cVar4 = *pcVar31;
        if (cVar3 == cVar4) {
          pcVar31 = pcVar31 + 1;
LAB_00237b75:
          pcVar23 = pcVar23 + 1;
        }
        else {
          if ((cVar3 == '-') || (cVar3 == ' ')) goto LAB_00237b75;
          if ((cVar4 != ' ') && (cVar4 != '-')) {
            if (cVar4 == '\0') {
              t42face->style_name = pcVar23;
            }
            break;
          }
          pcVar31 = pcVar31 + 1;
        }
      }
    }
  }
  t42face->num_fixed_sizes = 0;
  t42face->available_sizes = (FT_Bitmap_Size *)0x0;
  local_2e8._0_4_ = 9;
  loader.parser.root.memory = (FT_Memory)FT_Get_Module((t42face->driver->root).library,"truetype");
  loader.parser.root.cursor = (FT_Byte *)t42face[3].style_name;
  loader.parser.root.base = *(FT_Byte **)&t42face[3].num_fixed_sizes;
  if (num_params != 0) {
    local_2e8 = (undefined1  [8])((ulong)local_2e8 | 0x10);
    loader.parser.root.funcs.done = (_func_void_PS_Parser *)loader.swap_table.funcs.release;
    loader.parser.root.funcs.init._0_4_ = num_params;
  }
  FVar14 = FT_Open_Face((t42face->driver->root).library,(FT_Open_Args *)local_2e8,0,
                        (FT_Face_conflict *)&t42face[3].available_sizes);
  if (FVar14 != 0) {
    return FVar14;
  }
  FT_Done_Size(*(FT_Size *)(t42face[3].available_sizes + 5));
  pFVar8 = t42face[3].available_sizes;
  FVar9 = pFVar8[3].x_ppem;
  FVar10 = pFVar8[3].y_ppem;
  FVar11 = *(FT_Pos *)(pFVar8 + 4);
  (t42face->bbox).xMin = pFVar8[3].size;
  (t42face->bbox).yMin = FVar9;
  (t42face->bbox).xMax = FVar10;
  (t42face->bbox).yMax = FVar11;
  t42face->units_per_EM = (FT_UShort)pFVar8[4].size;
  t42face->ascender = *(FT_Short *)((long)&pFVar8[4].size + 2);
  t42face->descender = *(FT_Short *)((long)&pFVar8[4].size + 4);
  t42face->height = *(FT_Short *)((long)&pFVar8[4].size + 6);
  t42face->max_advance_width = (FT_Short)pFVar8[4].x_ppem;
  t42face->max_advance_height = *(FT_Short *)((long)&pFVar8[4].x_ppem + 2);
  t42face->underline_position = *(FT_Short *)((long)&t42face[1].style_name + 2);
  t42face->underline_thickness = *(FT_Short *)((long)&t42face[1].style_name + 4);
  t42face->style_flags = 0;
  uVar28 = (ulong)(t42face[1].family_name != (FT_String *)0x0);
  t42face->style_flags = uVar28;
  if ((pFVar8->y_ppem & 2) != 0) {
    t42face->style_flags = uVar28 | 2;
  }
  if ((pFVar8->x_ppem & 0x20) != 0) {
    *(byte *)&t42face->face_flags = (byte)t42face->face_flags | 0x20;
  }
  if (pvVar16 == (FT_Pointer)0x0) {
    return 0;
  }
  puVar29 = *(undefined8 **)(pFVar17 + 0x40);
  loader.parser.root.cursor = (FT_Byte *)0x10003756e6963;
  local_2e8 = (undefined1  [8])t42face;
  FVar14 = FT_CMap_New((FT_CMap_Class)puVar29[3],(FT_Pointer)0x0,(FT_CharMap)local_2e8,
                       (FT_CMap_conflict *)0x0);
  if (FVar14 != 0 && (char)FVar14 != -0x5d) {
    return FVar14;
  }
  loader.parser.root.cursor._0_6_ = CONCAT24(7,loader.parser.root.cursor._0_4_);
  FVar14 = 0;
  switch(*(undefined4 *)&t42face[2].style_name) {
  case 1:
    loader.parser.root.cursor = (FT_Byte *)CONCAT44(loader.parser.root.cursor._4_4_,0x41444243);
    loader.parser.root.cursor = (FT_Byte *)CONCAT26(2,loader.parser.root.cursor._0_6_);
    puVar29 = puVar29 + 2;
    break;
  case 2:
    loader.parser.root.cursor = (FT_Byte *)CONCAT44(loader.parser.root.cursor._4_4_,0x41444f42);
    loader.parser.root.cursor = (FT_Byte *)((ulong)loader.parser.root.cursor & 0xffffffffffff);
    break;
  case 3:
    puVar29 = puVar29 + 3;
    loader.parser.root.cursor = (FT_Byte *)CONCAT44(loader.parser.root.cursor._4_4_,0x6c617431);
    loader.parser.root.cursor = (FT_Byte *)CONCAT26(3,loader.parser.root.cursor._0_6_);
    break;
  case 4:
    loader.parser.root.cursor = (FT_Byte *)CONCAT44(loader.parser.root.cursor._4_4_,0x41444245);
    loader.parser.root.cursor = (FT_Byte *)CONCAT26(1,loader.parser.root.cursor._0_6_);
    puVar29 = puVar29 + 1;
    break;
  default:
    clazz = (FT_CMap_Class)0x0;
    goto LAB_00237e66;
  }
  clazz = (FT_CMap_Class)*puVar29;
LAB_00237e66:
  if (clazz != (FT_CMap_Class)0x0) {
    FVar14 = FT_CMap_New(clazz,(FT_Pointer)0x0,(FT_CharMap)local_2e8,(FT_CMap_conflict *)0x0);
  }
  return FVar14;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Face_Init( FT_Stream      stream,
                 FT_Face        t42face,       /* T42_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    T42_Face            face  = (T42_Face)t42face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    FT_Face             root  = (FT_Face)&face->root;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info  = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->ttf_face       = NULL;
    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T42_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    FT_TRACE2(( "Type 42 driver\n" ));

    /* open the tokenizer, this will also check the font format */
    error = T42_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T42_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Now load the font program into the face object */

    /* Init the face object fields */
    /* Now set up root face fields */

    root->num_glyphs   = type1->num_glyphs;
    root->num_charmaps = 0;
    root->face_index   = 0;

    root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                        FT_FACE_FLAG_HORIZONTAL  |
                        FT_FACE_FLAG_GLYPH_NAMES;

    if ( info->is_fixed_pitch )
      root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

#ifdef TT_CONFIG_OPTION_BYTECODE_INTERPRETER
    root->face_flags |= FT_FACE_FLAG_HINTER;
#endif

    /* XXX: TODO -- add kerning with .afm support */

    /* get style name -- be careful, some broken fonts only */
    /* have a `/FontName' dictionary entry!                 */
    root->family_name = info->family_name;
    /* assume "Regular" style if we don't know better */
    root->style_name = (char *)"Regular";
    if ( root->family_name )
    {
      char*  full   = info->full_name;
      char*  family = root->family_name;


      if ( full )
      {
        while ( *full )
        {
          if ( *full == *family )
          {
            family++;
            full++;
          }
          else
          {
            if ( *full == ' ' || *full == '-' )
              full++;
            else if ( *family == ' ' || *family == '-' )
              family++;
            else
            {
              if ( !*family )
                root->style_name = full;
              break;
            }
          }
        }
      }
    }
    else
    {
      /* do we have a `/FontName'? */
      if ( type1->font_name )
        root->family_name = type1->font_name;
    }

    /* no embedded bitmap support */
    root->num_fixed_sizes = 0;
    root->available_sizes = NULL;

    /* Load the TTF font embedded in the T42 font */
    {
      FT_Open_Args  args;


      args.flags       = FT_OPEN_MEMORY | FT_OPEN_DRIVER;
      args.driver      = FT_Get_Module( FT_FACE_LIBRARY( face ),
                                        "truetype" );
      args.memory_base = face->ttf_data;
      args.memory_size = face->ttf_size;

      if ( num_params )
      {
        args.flags     |= FT_OPEN_PARAMS;
        args.num_params = num_params;
        args.params     = params;
      }

      error = FT_Open_Face( FT_FACE_LIBRARY( face ),
                            &args, 0, &face->ttf_face );
    }

    if ( error )
      goto Exit;

    FT_Done_Size( face->ttf_face->size );

    /* Ignore info in FontInfo dictionary and use the info from the  */
    /* loaded TTF font.  The PostScript interpreter also ignores it. */
    root->bbox         = face->ttf_face->bbox;
    root->units_per_EM = face->ttf_face->units_per_EM;

    root->ascender  = face->ttf_face->ascender;
    root->descender = face->ttf_face->descender;
    root->height    = face->ttf_face->height;

    root->max_advance_width  = face->ttf_face->max_advance_width;
    root->max_advance_height = face->ttf_face->max_advance_height;

    root->underline_position  = (FT_Short)info->underline_position;
    root->underline_thickness = (FT_Short)info->underline_thickness;

    /* compute style flags */
    root->style_flags = 0;
    if ( info->italic_angle )
      root->style_flags |= FT_STYLE_FLAG_ITALIC;

    if ( face->ttf_face->style_flags & FT_STYLE_FLAG_BOLD )
      root->style_flags |= FT_STYLE_FLAG_BOLD;

    if ( face->ttf_face->face_flags & FT_FACE_FLAG_VERTICAL )
      root->face_flags |= FT_FACE_FLAG_VERTICAL;

    {
      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }
  Exit:
    return error;
  }